

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O0

bool dxil_spv::emit_check_access_fully_mapped_instruction(Impl *impl,CallInst *instruction)

{
  Id arg;
  Builder *this;
  Operation *this_00;
  Value *value;
  Operation *op;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  spv::Builder::addCapability(this,CapabilitySparseResidency);
  this_00 = Converter::Impl::allocate(impl,OpImageSparseTexelsResident,(Value *)instruction);
  value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  arg = Converter::Impl::get_id_for_value(impl,value,0);
  Operation::add_id(this_00,arg);
  Converter::Impl::add(impl,this_00,false);
  return true;
}

Assistant:

bool emit_check_access_fully_mapped_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	builder.addCapability(spv::CapabilitySparseResidency);
	auto *op = impl.allocate(spv::OpImageSparseTexelsResident, instruction);
	op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
	impl.add(op);
	return true;
}